

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::ConvertToUnixOutputPath(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  ulong uVar6;
  string result;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  uVar6 = 1;
  while( true ) {
    uVar6 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x4ccebd,uVar6);
    if (uVar6 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar6);
  }
  lVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x48cd85,0);
  if (lVar3 != -1) {
    local_40 = 0;
    local_38 = 0;
    pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar2 = *pcVar5;
    local_48 = &local_38;
    if (cVar2 != '\0') {
      cVar4 = '\x01';
      do {
        if ((cVar2 == ' ') && (cVar4 != '\\')) {
          std::__cxx11::string::push_back((char)&local_48);
        }
        std::__cxx11::string::push_back((char)&local_48);
        cVar4 = *pcVar5;
        cVar2 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar2 != '\0');
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::ConvertToUnixOutputPath(const std::string& path)
{
  std::string ret = path;

  // remove // except at the beginning might be a cygwin drive
  std::string::size_type pos = 1;
  while ((pos = ret.find("//", pos)) != std::string::npos) {
    ret.erase(pos, 1);
  }
  // escape spaces and () in the path
  if (ret.find_first_of(" ") != std::string::npos) {
    std::string result;
    char lastch = 1;
    for (const char* ch = ret.c_str(); *ch != '\0'; ++ch) {
      // if it is already escaped then don't try to escape it again
      if ((*ch == ' ') && lastch != '\\') {
        result += '\\';
      }
      result += *ch;
      lastch = *ch;
    }
    ret = result;
  }
  return ret;
}